

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

ptr<Expression> __thiscall Parser::primary(Parser *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  Parser *in_RSI;
  ptr<Expression> pVar3;
  ptr<Expression> expr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  bVar1 = match(in_RSI,Identifier);
  if (bVar1) {
    variable((Parser *)&stack0xffffffffffffffd8);
    this_00 = local_20;
    if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_20->_M_use_count = local_20->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_20->_M_use_count = local_20->_M_use_count + 1;
      }
    }
    pVar3 = postfix(this,(ptr<Expression> *)in_RSI);
    _Var2 = pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      _Var2._M_pi = extraout_RDX_00;
    }
    if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
      _Var2._M_pi = extraout_RDX_01;
    }
  }
  else {
    bVar1 = match(in_RSI,LeftParen);
    if (bVar1) {
      consume(in_RSI,LeftParen,"\'(\'");
      expression(this);
      consume(in_RSI,RightParen,"\')\'");
      _Var2._M_pi = extraout_RDX;
    }
    else {
      pVar3 = value(this);
      _Var2 = pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    }
  }
  pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Expression>)pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Expression> Parser::primary() {
    if(match(TokenType::Identifier)) {
        ptr<Expression> expr = variable();
        return postfix(expr);
    } else if(match(TokenType::LeftParen)) {
        consume(TokenType::LeftParen, "'('");
        ptr<Expression> expr = expression();
        consume(TokenType::RightParen, "')'");
        return expr;
    } else {
        return value();
    }
}